

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeRefFunc(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name func)

{
  HeapType heapType;
  Function *pFVar1;
  RefFunc *this_00;
  
  pFVar1 = Module::getFunction(this->wasm,func);
  heapType.id = (pFVar1->type).id;
  this_00 = (RefFunc *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = RefFuncId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 0;
  (this_00->func).super_IString.str._M_len = 0;
  (this_00->func).super_IString.str._M_len = func.super_IString.str._M_len;
  (this_00->func).super_IString.str._M_str = func.super_IString.str._M_str;
  RefFunc::finalize(this_00,heapType);
  push(this,(Expression *)this_00);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeRefFunc(Name func) {
  push(builder.makeRefFunc(func, wasm.getFunction(func)->type));
  return Ok{};
}